

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_get_channel_binding(Curl_easy *data,int sockindex,dynbuf *binding)

{
  X509 *pXVar1;
  undefined8 uVar2;
  int iVar3;
  CURLcode CVar4;
  char *name;
  char *local_f0;
  ssl_connect_data *connssl;
  Curl_cftype *cft;
  ossl_ctx *octx;
  Curl_cfilter *cf;
  connectdata *conn;
  char prefix [22];
  uchar local_98 [8];
  uchar buf [64];
  uint local_4c;
  char *pcStack_48;
  uint length;
  char *algo_name;
  EVP_MD *algo_type;
  X509 *pXStack_30;
  int algo_nid;
  X509 *cert;
  dynbuf *binding_local;
  Curl_easy *pCStack_18;
  int sockindex_local;
  Curl_easy *data_local;
  
  conn = (connectdata *)0x767265732d736c74;
  builtin_strncpy(prefix,"er-end-point:",0xe);
  octx = (ossl_ctx *)data->conn->cfilter[sockindex];
  cft = (Curl_cftype *)0x0;
  cert = (X509 *)binding;
  binding_local._4_4_ = sockindex;
  pCStack_18 = data;
  do {
    pXVar1 = octx->server_cert;
    if ((*(long *)octx->ssl_ctx != 0) && (iVar3 = strcmp(*(char **)octx->ssl_ctx,"SSL"), iVar3 == 0)
       ) {
      cft = *(Curl_cftype **)(pXVar1 + 0x40);
      break;
    }
    if (octx->ssl != (SSL *)0x0) {
      octx = (ossl_ctx *)octx->ssl;
    }
  } while (octx->ssl != (SSL *)0x0);
  if (cft == (Curl_cftype *)0x0) {
    Curl_failf(pCStack_18,"Failed to find the SSL filter");
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    uVar2._0_4_ = cft->flags;
    uVar2._4_4_ = cft->log_level;
    pXStack_30 = (X509 *)SSL_get1_peer_certificate(uVar2);
    if (pXStack_30 == (X509 *)0x0) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      iVar3 = X509_get_signature_nid(pXStack_30);
      iVar3 = OBJ_find_sigid_algs(iVar3,(int *)((long)&algo_type + 4),(int *)0x0);
      if (iVar3 == 0) {
        Curl_failf(pCStack_18,"Unable to find digest NID for certificate signature algorithm");
        data_local._4_4_ = CURLE_SSL_INVALIDCERTSTATUS;
      }
      else {
        if ((algo_type._4_4_ == 4) || (algo_type._4_4_ == 0x40)) {
          algo_name = (char *)EVP_sha256();
        }
        else {
          name = OBJ_nid2sn(algo_type._4_4_);
          algo_name = (char *)EVP_get_digestbyname(name);
          if ((EVP_MD *)algo_name == (EVP_MD *)0x0) {
            pcStack_48 = OBJ_nid2sn(algo_type._4_4_);
            local_f0 = pcStack_48;
            if (pcStack_48 == (char *)0x0) {
              local_f0 = "(null)";
            }
            Curl_failf(pCStack_18,"Could not find digest algorithm %s (NID %d)",local_f0,
                       (ulong)algo_type._4_4_);
            return CURLE_SSL_INVALIDCERTSTATUS;
          }
        }
        iVar3 = X509_digest(pXStack_30,(EVP_MD *)algo_name,local_98,&local_4c);
        if (iVar3 == 0) {
          Curl_failf(pCStack_18,"X509_digest() failed");
          data_local._4_4_ = CURLE_SSL_INVALIDCERTSTATUS;
        }
        else {
          CVar4 = Curl_dyn_addn((dynbuf *)cert,&conn,0x15);
          if (CVar4 == CURLE_OK) {
            CVar4 = Curl_dyn_addn((dynbuf *)cert,local_98,(ulong)local_4c);
            if (CVar4 == CURLE_OK) {
              data_local._4_4_ = CURLE_OK;
            }
            else {
              data_local._4_4_ = CURLE_OUT_OF_MEMORY;
            }
          }
          else {
            data_local._4_4_ = CURLE_OUT_OF_MEMORY;
          }
        }
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ossl_get_channel_binding(struct Curl_easy *data, int sockindex,
                                         struct dynbuf *binding)
{
  /* required for X509_get_signature_nid support */
#if OPENSSL_VERSION_NUMBER > 0x10100000L
  X509 *cert;
  int algo_nid;
  const EVP_MD *algo_type;
  const char *algo_name;
  unsigned int length;
  unsigned char buf[EVP_MAX_MD_SIZE];

  const char prefix[] = "tls-server-end-point:";
  struct connectdata *conn = data->conn;
  struct Curl_cfilter *cf = conn->cfilter[sockindex];
  struct ossl_ctx *octx = NULL;

  do {
    const struct Curl_cftype *cft = cf->cft;
    struct ssl_connect_data *connssl = cf->ctx;

    if(cft->name && !strcmp(cft->name, "SSL")) {
      octx = (struct ossl_ctx *)connssl->backend;
      break;
    }

    if(cf->next)
      cf = cf->next;

  } while(cf->next);

  if(!octx) {
    failf(data, "Failed to find the SSL filter");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  cert = SSL_get1_peer_certificate(octx->ssl);
  if(!cert) {
    /* No server certificate, don't do channel binding */
    return CURLE_OK;
  }

  if(!OBJ_find_sigid_algs(X509_get_signature_nid(cert), &algo_nid, NULL)) {
    failf(data,
          "Unable to find digest NID for certificate signature algorithm");
    return CURLE_SSL_INVALIDCERTSTATUS;
  }

  /* https://datatracker.ietf.org/doc/html/rfc5929#section-4.1 */
  if(algo_nid == NID_md5 || algo_nid == NID_sha1) {
    algo_type = EVP_sha256();
  }
  else {
    algo_type = EVP_get_digestbynid(algo_nid);
    if(!algo_type) {
      algo_name = OBJ_nid2sn(algo_nid);
      failf(data, "Could not find digest algorithm %s (NID %d)",
            algo_name ? algo_name : "(null)", algo_nid);
      return CURLE_SSL_INVALIDCERTSTATUS;
    }
  }

  if(!X509_digest(cert, algo_type, buf, &length)) {
    failf(data, "X509_digest() failed");
    return CURLE_SSL_INVALIDCERTSTATUS;
  }

  /* Append "tls-server-end-point:" */
  if(Curl_dyn_addn(binding, prefix, sizeof(prefix) - 1) != CURLE_OK)
    return CURLE_OUT_OF_MEMORY;
  /* Append digest */
  if(Curl_dyn_addn(binding, buf, length))
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
#else
  /* No X509_get_signature_nid support */
  (void)data; /* unused */
  (void)sockindex; /* unused */
  (void)binding; /* unused */
  return CURLE_OK;
#endif
}